

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

bool check_reconnect(DESCRIPTOR_DATA *d,char *name,bool fConn)

{
  string_view fmt;
  CHAR_DATA *pCVar1;
  bool bVar2;
  char *pcVar3;
  byte in_DL;
  DESCRIPTOR_DATA *in_RDI;
  OBJ_DATA *obj;
  CHAR_DATA *fch_next;
  CHAR_DATA *fch;
  CHAR_DATA *ch;
  CHAR_DATA *in_stack_00000070;
  int in_stack_000011dc;
  long in_stack_000011e0;
  long in_stack_000011e8;
  OBJ_DATA *in_stack_000011f0;
  CHAR_DATA *in_stack_000011f8;
  char *in_stack_00001200;
  CHAR_DATA *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  CHAR_DATA *ch_00;
  CHAR_DATA *local_58;
  char **in_stack_ffffffffffffffb8;
  OBJ_DATA *args;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  CHAR_DATA *ch_01;
  CHAR_DATA *pCVar4;
  
  pCVar4 = char_list;
  do {
    if (pCVar4 == (CHAR_DATA *)0x0) {
      return false;
    }
    bVar2 = is_npc(in_stack_ffffffffffffff88);
    if ((!bVar2) && (((in_DL & 1) == 0 || (pCVar4->desc == (DESCRIPTOR_DATA *)0x0)))) {
      if (in_RDI->character->true_name == (char *)0x0) {
        local_58 = (CHAR_DATA *)in_RDI->character->name;
      }
      else {
        local_58 = (CHAR_DATA *)in_RDI->character->true_name;
      }
      if (pCVar4->true_name == (char *)0x0) {
        ch_00 = (CHAR_DATA *)pCVar4->name;
      }
      else {
        ch_00 = (CHAR_DATA *)pCVar4->true_name;
      }
      bVar2 = str_cmp((char *)local_58,(char *)ch_00);
      if (!bVar2) {
        pCVar1 = char_list;
        if ((in_DL & 1) == 0) {
          free_pstring(in_stack_ffffffffffffff90);
          pcVar3 = palloc_string((char *)in_stack_ffffffffffffffb8);
          in_RDI->character->pcdata->pwd = pcVar3;
        }
        else {
          while (ch_01 = pCVar1, ch_01 != (CHAR_DATA *)0x0) {
            in_stack_ffffffffffffffc8 = ch_01->next;
            bVar2 = is_npc(in_stack_ffffffffffffff88);
            pCVar1 = in_stack_ffffffffffffffc8;
            if ((bVar2) &&
               (((bVar2 = is_affected(ch_01,(int)gsn_animate_dead), bVar2 ||
                 (bVar2 = is_affected_by(ch_00,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20)),
                 pCVar1 = in_stack_ffffffffffffffc8, bVar2)) &&
                (pCVar1 = in_stack_ffffffffffffffc8, ch_01->master == in_RDI->character)))) {
              extract_char(in_stack_00000070,d._7_1_);
              pCVar1 = in_stack_ffffffffffffffc8;
            }
          }
          free_char(local_58);
          in_RDI->character = pCVar4;
          pCVar4->desc = in_RDI;
          pCVar4->timer = 0;
          send_to_char((char *)local_58,ch_00);
          if (pCVar4->invis_level < 0x33) {
            act((char *)local_58,ch_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
          }
          pcVar3 = palloc_string((char *)in_stack_ffffffffffffffb8);
          pCVar4->pcdata->host = pcVar3;
          for (args = pCVar4->carrying; args != (OBJ_DATA *)0x0; args = args->next_content) {
            args->pIndexData->limcount = args->pIndexData->limcount + 1;
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_58,(char *)ch_00);
          fmt._M_str = (char *)pCVar4;
          fmt._M_len = (size_t)ch_01;
          CLogger::Info<char*&,char*&>
                    ((CLogger *)in_stack_ffffffffffffffc8,fmt,(char **)args,
                     in_stack_ffffffffffffffb8);
          get_trust(in_stack_ffffffffffffff88);
          wiznet(in_stack_00001200,in_stack_000011f8,in_stack_000011f0,in_stack_000011e8,
                 in_stack_000011e0,in_stack_000011dc);
          in_RDI->connected = 0;
        }
        return true;
      }
    }
    pCVar4 = pCVar4->next;
  } while( true );
}

Assistant:

bool check_reconnect(DESCRIPTOR_DATA *d, char *name, bool fConn)
{
	CHAR_DATA *ch, *fch, *fch_next;
	OBJ_DATA *obj;

	for (ch = char_list; ch != nullptr; ch = ch->next)
	{
		if (!is_npc(ch)
			&& (!fConn || ch->desc == nullptr)
			&& !str_cmp((d->character->true_name ? d->character->true_name : d->character->name), (ch->true_name ? ch->true_name : ch->name)))
		{
			if (fConn == false)
			{
				free_pstring(d->character->pcdata->pwd);
				d->character->pcdata->pwd = palloc_string(ch->pcdata->pwd);
			}
			else
			{
				for (fch = char_list; fch; fch = fch_next)
				{
					fch_next = fch->next;
					if (is_npc(fch)
						&& (is_affected(fch, gsn_animate_dead) || is_affected_by(fch, AFF_CHARM))
						&& fch->master == d->character)
					{
						extract_char(fch, true);
					}
				}

				free_char(d->character);
				d->character = ch;

				ch->desc = d;
				ch->timer = 0;

				send_to_char("Reconnecting. Type replay to see missed tells.\n\r", ch);

				if (ch->invis_level < 51)
					act("$n has reconnected.", ch, nullptr, nullptr, TO_ROOM);

				ch->pcdata->host = palloc_string(ch->desc->host);
				/* Limit crap to balance reconnect objects from extracted link object */
				for (obj = ch->carrying; obj != nullptr; obj = obj->next_content)
				{
					obj->pIndexData->limcount++;
				}

				RS.Logger.Info("{}@{} reconnected.", ch->name, d->host);

				wiznet("$N recovers from link death.", ch, nullptr, WIZ_LINKS, 0, get_trust(ch));
				d->connected = CON_PLAYING;
			}

			return true;
		}
	}

	return false;
}